

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Itemset.cc
# Opt level: O3

void __thiscall Itemset::Itemset(Itemset *this,int it_sz,int ival_sz,int nclass,bool print)

{
  Array *pAVar1;
  value_type_conflict local_2c;
  
  (this->clsSup).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->clsSup).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->clsSup).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->theItemset).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->theItemset).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->theIval).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->theIval).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->num_class = nclass;
  this->do_print = print;
  pAVar1 = (Array *)operator_new(0x18);
  Array::Array(pAVar1,it_sz);
  std::__shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>::reset<Array>
            ((__shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2> *)this,pAVar1);
  pAVar1 = (Array *)operator_new(0x18);
  Array::Array(pAVar1,ival_sz);
  std::__shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>::reset<Array>
            (&(this->theIval).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>,pAVar1);
  this->theSupport = 0;
  local_2c = 0;
  std::vector<int,_std::allocator<int>_>::resize(&this->clsSup,(long)this->num_class,&local_2c);
  return;
}

Assistant:

Itemset::Itemset(int it_sz, int ival_sz, int nclass, bool print) {
    num_class = nclass;
    do_print = print;
    theItemset.reset(new Array(it_sz));
    theIval.reset(new Array(ival_sz));
    theSupport = 0;
    clsSup.resize(num_class, 0);
}